

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O1

void __thiscall QLabel::setText(QLabel *this,QString *text)

{
  QLabelPrivate *this_00;
  long lVar1;
  long lVar2;
  QWidgetTextControl *pQVar3;
  Data *pDVar4;
  qsizetype qVar5;
  char cVar6;
  FocusPolicy FVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QAnyStringView QVar9;
  QStringView QVar10;
  QString local_58;
  undefined8 uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  lVar1 = (this_00->text).d.size;
  lVar2 = (text->d).size;
  if (lVar1 == lVar2) {
    QVar8.m_data = (this_00->text).d.ptr;
    QVar8.m_size = lVar1;
    QVar10.m_data = (text->d).ptr;
    QVar10.m_size = lVar2;
    cVar6 = QtPrivate::equalStrings(QVar8,QVar10);
    if (cVar6 != '\0') goto LAB_00416a81;
  }
  pQVar3 = this_00->control;
  this_00->control = (QWidgetTextControl *)0x0;
  QLabelPrivate::clearContents(this_00);
  QString::operator=(&this_00->text,(QString *)text);
  this_00->field_0x340 = this_00->field_0x340 | 0x18;
  if (this_00->textformat == AutoText) {
    QVar9.m_size = (this_00->text).d.size | 0x8000000000000000;
    QVar9.field_0.m_data_utf16 = (this_00->text).d.ptr;
    cVar6 = Qt::mightBeRichText(QVar9);
    if (cVar6 == '\0') {
      this_00->effectiveTextFormat = PlainText;
    }
    else {
      this_00->effectiveTextFormat = RichText;
    }
  }
  else {
    this_00->effectiveTextFormat = this_00->textformat;
  }
  this_00->control = pQVar3;
  if ((this_00->field_0x340 & 0x10) == 0) {
LAB_00416974:
    if (this_00->control != (QWidgetTextControl *)0x0) {
      (**(code **)(*(long *)this_00->control + 0x20))();
    }
    this_00->control = (QWidgetTextControl *)0x0;
  }
  else {
    if ((this_00->effectiveTextFormat == PlainText) &&
       (((this_00->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
         super_QFlagsStorage<Qt::TextInteractionFlag>.i & 3) == 0)) {
      FVar7 = QWidget::focusPolicy
                        (*(QWidget **)&(this_00->super_QFramePrivate).super_QWidgetPrivate.field_0x8
                        );
      if (FVar7 == NoFocus) goto LAB_00416974;
    }
    QLabelPrivate::ensureTextControl(this_00);
  }
  if (this_00->effectiveTextFormat != PlainText) {
    QWidget::setAttribute((QWidget *)this,WA_MouseTracking,true);
  }
  pDVar4 = (this_00->buddy).wp.d;
  if (((pDVar4 != (Data *)0x0) && (*(int *)(pDVar4 + 4) != 0)) &&
     ((this_00->buddy).wp.value != (QObject *)0x0)) {
    QLabelPrivate::updateShortcut(this_00);
  }
  QLabelPrivate::updateLabel(this_00);
  QWidget::accessibleName(&local_58,(QWidget *)this);
  qVar5 = local_58.d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QLabel *)qVar5 == (QLabel *)0x0) {
    local_58.d.d = (Data *)QFont::strikeOut;
    local_58.d.ptr = (char16_t *)0xaaaaaaaa0000800c;
    uStack_40 = 0xaaaaaaaaffffffff;
    local_58.d.size = (qsizetype)this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
  }
LAB_00416a81:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::setText(const QString &text)
{
    Q_D(QLabel);
    if (d->text == text)
        return;

    QWidgetTextControl *oldControl = d->control;
    d->control = nullptr;

    d->clearContents();
    d->text = text;
    d->isTextLabel = true;
    d->textDirty = true;
    if (d->textformat == Qt::AutoText) {
        if (Qt::mightBeRichText(d->text))
            d->effectiveTextFormat = Qt::RichText;
        else
            d->effectiveTextFormat = Qt::PlainText;
    } else {
        d->effectiveTextFormat = d->textformat;
    }

    d->control = oldControl;

    if (d->needTextControl()) {
        d->ensureTextControl();
    } else {
        delete d->control;
        d->control = nullptr;
    }

    if (d->effectiveTextFormat != Qt::PlainText) {
        setMouseTracking(true);
    } else {
        // Note: mouse tracking not disabled intentionally
    }

#ifndef QT_NO_SHORTCUT
    if (d->buddy)
        d->updateShortcut();
#endif

    d->updateLabel();

#if QT_CONFIG(accessibility)
    if (accessibleName().isEmpty()) {
        QAccessibleEvent event(this, QAccessible::NameChanged);
        QAccessible::updateAccessibility(&event);
    }
#endif
}